

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int setup_vischar_plotting(tgestate_t *state,vischar_t *vischar)

{
  int iVar1;
  vischar_t *in_RSI;
  size_t *psVar2;
  tgestate_t *in_RDI;
  uint16_t skip;
  uint16_t y;
  uint8_t *maskbuf;
  int16_t x;
  uint8_t A;
  uint8_t instr;
  uint8_t iters;
  uint8_t counter;
  uint8_t enable_count;
  size_t *enables;
  uint8_t clipped_height;
  uint8_t top_skip;
  uint8_t clipped_width;
  uint8_t left_skip;
  spritedef_t *sprite2;
  spriteindex_t sprite_index;
  spritedef_t *sprite;
  mappos8_t *mappos_stash;
  mappos16_t *vischar_pos;
  ushort local_62;
  byte local_55;
  byte local_54;
  char local_53;
  uint8_t local_52;
  char local_51;
  size_t *local_50;
  uint8_t local_44;
  byte local_43;
  uint8_t local_42;
  uint8_t local_41;
  spritedef_t *local_40;
  byte local_31;
  spritedef_t *local_30;
  mappos8_t *local_28;
  movableitem_t *local_20;
  vischar_t *local_18;
  tgestate_t *local_10;
  int local_4;
  
  local_20 = &in_RSI->mi;
  local_28 = &in_RDI->mappos_stash;
  if (in_RDI->room_index == '\0') {
    local_28->u = (uint8_t)((int)((local_20->mappos).u + 4) >> 3);
    (in_RDI->mappos_stash).v = (uint8_t)((int)(uint)(in_RSI->mi).mappos.v >> 3);
    (in_RDI->mappos_stash).w = (uint8_t)((int)(uint)(in_RSI->mi).mappos.w >> 3);
  }
  else {
    local_28->u = (uint8_t)(local_20->mappos).u;
    (in_RDI->mappos_stash).v = (uint8_t)(in_RSI->mi).mappos.v;
    (in_RDI->mappos_stash).w = (uint8_t)(in_RSI->mi).mappos.w;
  }
  local_30 = (in_RSI->mi).sprite;
  local_31 = (in_RSI->mi).sprite_index;
  in_RDI->sprite_index = local_31;
  (in_RDI->isopos).x = (uint8_t)((int)(uint)(in_RSI->isopos).x >> 3);
  (in_RDI->isopos).y = (uint8_t)((int)(uint)(in_RSI->isopos).y >> 3);
  local_40 = local_30 + (int)(local_31 & 0xffffff7f);
  in_RSI->width_bytes = local_40->width;
  in_RSI->height = local_40->height;
  in_RDI->bitmap_pointer = local_40->bitmap;
  in_RDI->mask_pointer = local_40->mask;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = vischar_visible(in_RDI,in_RSI,&local_41,&local_42,&local_43,&local_44);
  if (iVar1 == 0) {
    if (local_18->width_bytes == '\x03') {
      (local_10->spriteplotter).height_16_left = local_44;
      (local_10->spriteplotter).height_16_right = local_44;
      local_51 = '\x03';
      local_50 = masked_sprite_plotter_16_enables;
    }
    else {
      (local_10->spriteplotter).height_24_right = local_44;
      (local_10->spriteplotter).height_24_left = local_44;
      local_51 = '\x04';
      local_50 = setup_vischar_plotting::masked_sprite_plotter_24_enables;
    }
    if (local_41 == '\0') {
      local_54 = 0x77;
      local_52 = local_42;
    }
    else {
      local_54 = 0;
      local_52 = local_51 - local_42;
    }
    local_53 = local_51;
    do {
      psVar2 = local_50 + 1;
      *(byte *)((long)local_10->jmpbuf_main[0].__jmpbuf + (*local_50 - 0x20)) = local_54;
      local_50 = local_50 + 2;
      *(byte *)((long)local_10->jmpbuf_main[0].__jmpbuf + (*psVar2 - 0x20)) = local_54;
      local_52 = local_52 + 0xff;
      if (local_52 == '\0') {
        local_54 = local_54 ^ 0x77;
      }
      local_53 = local_53 + -1;
    } while (local_53 != '\0');
    local_62 = 0;
    if (local_43 == 0) {
      local_62 = ((local_18->isopos).y + (ushort)(local_10->map_position).y * -8) *
                 (short)local_10->columns;
    }
    local_10->window_buf_pointer =
         local_10->window_buf +
         (int)((int)(short)((ushort)(local_10->isopos).x - (ushort)(local_10->map_position).x) +
              (uint)local_62);
    local_10->foreground_mask_pointer =
         local_10->mask_buffer + (int)((uint)local_43 * 4 + ((local_18->isopos).y & 7) * 4);
    local_55 = local_43;
    if (local_43 != 0) {
      local_55 = local_43 * (local_18->width_bytes + 0xff);
    }
    local_10->bitmap_pointer = local_10->bitmap_pointer + (int)(uint)(ushort)local_55;
    local_10->mask_pointer = local_10->mask_pointer + (int)(uint)(ushort)local_55;
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int setup_vischar_plotting(tgestate_t *state, vischar_t *vischar)
{
  /**
   * $E0EC: Addresses of self-modified locations which are changed between
   * NOPs and LD (HL),A.
   */
  static const size_t masked_sprite_plotter_24_enables[4 * 2] =
  {
    offsetof(tgestate_t, spriteplotter.enable_24_right_1),
    offsetof(tgestate_t, spriteplotter.enable_24_left_1),
    offsetof(tgestate_t, spriteplotter.enable_24_right_2),
    offsetof(tgestate_t, spriteplotter.enable_24_left_2),
    offsetof(tgestate_t, spriteplotter.enable_24_right_3),
    offsetof(tgestate_t, spriteplotter.enable_24_left_3),
    offsetof(tgestate_t, spriteplotter.enable_24_right_4),
    offsetof(tgestate_t, spriteplotter.enable_24_left_4),

    /* These two addresses are present here in the original game but are
     * unreferenced. */
    // masked_sprite_plotter_16_wide_vischar
    // masked_sprite_plotter_24_wide_vischar
  };

  mappos16_t        *vischar_pos;    /* was HL */
  mappos8_t         *mappos_stash;   /* was DE */
  const spritedef_t *sprite;         /* was BC */
  spriteindex_t      sprite_index;   /* was A */
  const spritedef_t *sprite2;        /* was DE */
  uint8_t            left_skip;      /* was B */
  uint8_t            clipped_width;  /* was C */
  uint8_t            top_skip;       /* was D */
  uint8_t            clipped_height; /* was E */
  const size_t      *enables;        /* was HL */
  uint8_t            enable_count;   /* was $E4C0 */
  uint8_t            counter;        /* was A' */
  uint8_t            iters;          /* was B' */
  uint8_t            instr;          /* was A */
  uint8_t            A;              /* was A */
  int16_t            x;              /* was HL */
  uint8_t           *maskbuf;        /* was HL */
  uint16_t           y;              /* was DE */
  uint16_t           skip;           /* was DE */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  vischar_pos  = &vischar->mi.mappos;
  mappos_stash = &state->mappos_stash;

  if (state->room_index > room_0_OUTDOORS)
  {
    /* Indoors. */
    mappos_stash->u = vischar_pos->u; // note: narrowing
    mappos_stash->v = vischar_pos->v; // note: narrowing
    mappos_stash->w = vischar_pos->w; // note: narrowing
  }
  else
  {
    /* Outdoors. */
    /* Conv: Unrolled, removed divide-by-8 calls. */
    mappos_stash->u = (vischar_pos->u + 4) >> 3; /* with rounding */
    mappos_stash->v = (vischar_pos->v    ) >> 3; /* without rounding */
    mappos_stash->w = (vischar_pos->w    ) >> 3;
  }

  sprite = vischar->mi.sprite;

  // banked in A'
  state->sprite_index = sprite_index = vischar->mi.sprite_index; // set left/right flip flag / sprite offset

  // HL now points after sprite_index, at isopos
  // DE now points to state->isopos.x

  // unrolled versus original
  state->isopos.x = vischar->isopos.x >> 3;
  state->isopos.y = vischar->isopos.y >> 3;
  // 'isopos' here is now a scaled-down projected map coordinate

  // A is (1<<7) mask OR sprite offset
  // original game uses ADD A,A to double A and in doing so discards top bit, here we mask it off explicitly
  sprite2 = &sprite[sprite_index & ~sprite_FLAG_FLIP]; // sprite pointer

  vischar->width_bytes = sprite2->width;  /* width in bytes + 1 */
  vischar->height      = sprite2->height; /* height in rows */

  state->bitmap_pointer = sprite2->bitmap;
  state->mask_pointer   = sprite2->mask;

  if (vischar_visible(state,
                      vischar,
                     &left_skip,
                     &clipped_width,
                     &top_skip,
                     &clipped_height)) // used A as temporary
    return 0; /* invisible */

  // PUSH clipped_width
  // PUSH clipped_height

  assert(clipped_width < 100);
  assert(clipped_height < 100);

  if (vischar->width_bytes == 3) // 3 => 16 wide, 4 => 24 wide
  {
    state->spriteplotter.height_16_left  = clipped_height; // self modify masked_sprite_plotter_16_wide_left
    state->spriteplotter.height_16_right = clipped_height; // self-modify masked_sprite_plotter_16_wide_right

    enable_count = 3;
    enables = &masked_sprite_plotter_16_enables[0];
  }
  else
  {
    state->spriteplotter.height_24_right = clipped_height; // self-modify masked_sprite_plotter_24_wide_vischar (shift right case)
    state->spriteplotter.height_24_left  = clipped_height; // self-modify masked_sprite_plotter_24_wide_vischar (shift left case)

    enable_count = 4;
    enables = &masked_sprite_plotter_24_enables[0];
  }

  // PUSH HL_enables

  // enable_count = A; // self-modify
  // E = A
  // A = B
  if (left_skip == 0) // no lefthand skip: start with 'on'
  {
    instr = 119; /* opcode of 'LD (HL),A' */
    counter = clipped_width; // process this many bytes before clipping
  }
  else // lefthand skip present: start with 'off'
  {
    instr = 0; /* opcode of 'NOP' */
    counter = enable_count - clipped_width; // clip until this many bytes have been processed
  }

  // EXX
  // POP HL_enables

  /* Set the addresses in the jump table to NOP or LD (HL),A. */
  //Cdash = offset; // must be no of columns?
  iters = enable_count; /* 3 or 4 iterations */
  do
  {
    *(((uint8_t *) state) + *enables++) = instr;
    *(((uint8_t *) state) + *enables++) = instr;
    if (--counter == 0)
      instr ^= 119; /* Toggle between LD and NOP. */
  }
  while (--iters);

  // EXX

  assert(vischar->isopos.y / 8 - state->map_position.y < state->rows);
  assert(vischar->isopos.y / 8 - state->map_position.y + clipped_height / 8 <= state->rows);

  /* Calculate Y plotting offset.
   * The full calculation can be avoided if there are rows to skip since
   * the sprite is always aligned to the top of the screen in that case. */
  y = 0; /* Conv: Moved. */
  if (top_skip == 0) /* no rows to skip */
    y = (vischar->isopos.y - state->map_position.y * 8) * state->columns;

  assert(y / 8 / state->columns < state->rows);

  /* Calculate X plotting offset. */
  x = state->isopos.x - state->map_position.x; // signed subtract + extend to 16-bit

  assert(x >= -3 && x <= state->columns - 1); // found empirically

  state->window_buf_pointer = &state->window_buf[x + y];

  /* Note that it _is_ valid for window_buf_pointer to point outside of
   * window_buf. It can point beyond the end by up to the width of the sprite
   * (vischar->width_bytes - 1) [char->width_bytes is (vischar width in
   * bytes + 1)] and that's fine since the clipping enable flags ensure that
   * those locations are never written to.
   */

  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer, vischar->width_bytes - 1);
  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer + (clipped_height - 1) * state->columns + clipped_width - 1, vischar->width_bytes - 1);

  maskbuf = &state->mask_buffer[0];

  // POP DE_clipped_height
  // PUSH DE

  assert((top_skip * 4 + (vischar->isopos.y & 7) * 4) < 255);

  maskbuf += top_skip * 4 + (vischar->isopos.y & 7) * 4;
  ASSERT_MASK_BUF_PTR_VALID(maskbuf);
  state->foreground_mask_pointer = maskbuf;

  // POP DE_clipped_height

  A = top_skip; // offset/skip
  if (A)
  {
    /* Conv: The original game has a generic multiply loop here. In this
     * version instead we'll just multiply. */

    A *= vischar->width_bytes - 1;
    // top_skip = 0
  }

  /* D ends up as zero either way. */

  skip = A;
  state->bitmap_pointer += skip;
  state->mask_pointer   += skip;

  // POP clipped_width  // why save it anyway? if it's just getting popped. unless it's being returned.

  return 1; /* visible */ // Conv: Added.
}